

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.h
# Opt level: O0

Analysis __thiscall
spvtools::opt::CombineAccessChains::GetPreservedAnalyses(CombineAccessChains *this)

{
  Analysis AVar1;
  CombineAccessChains *this_local;
  
  AVar1 = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  AVar1 = operator|(AVar1,kAnalysisDecorations);
  AVar1 = operator|(AVar1,kAnalysisCombinators);
  AVar1 = operator|(AVar1,kAnalysisCFG);
  AVar1 = operator|(AVar1,kAnalysisDominatorAnalysis);
  AVar1 = operator|(AVar1,kAnalysisNameMap);
  AVar1 = operator|(AVar1,kAnalysisConstants);
  AVar1 = operator|(AVar1,kAnalysisTypes);
  return AVar1;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisDecorations | IRContext::kAnalysisCombinators |
           IRContext::kAnalysisCFG | IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisNameMap | IRContext::kAnalysisConstants |
           IRContext::kAnalysisTypes;
  }